

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenutypes.cpp
# Opt level: O2

QDBusArgument * operator<<(QDBusArgument *arg,QDBusMenuLayoutItem *item)

{
  int elementMetaTypeId;
  QDBusArgument *arg_00;
  long lVar1;
  QDBusMenuLayoutItem *child;
  QDBusMenuLayoutItem *value;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginStructure();
  arg_00 = (QDBusArgument *)QDBusArgument::operator<<(arg,item->m_id);
  operator<<(arg_00,&item->m_properties);
  elementMetaTypeId = qMetaTypeId<QDBusVariant>();
  QDBusArgument::beginArray(arg,elementMetaTypeId);
  value = (item->m_children).d.ptr;
  for (lVar1 = (item->m_children).d.size * 0x28; lVar1 != 0; lVar1 = lVar1 + -0x28) {
    QVariant::fromValue<QDBusMenuLayoutItem>
              ((enable_if_t<std::is_copy_constructible_v<QDBusMenuLayoutItem>_&&_std::is_destructible_v<QDBusMenuLayoutItem>,_QVariant>
                *)&local_78,value);
    local_58._16_8_ = local_78._16_8_;
    uStack_40 = uStack_60;
    local_58.shared = local_78.shared;
    local_58._8_8_ = local_78._8_8_;
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = 0;
    local_78._16_8_ = 0;
    uStack_60 = 2;
    QDBusArgument::operator<<(arg,(QDBusVariant *)&local_58);
    QVariant::~QVariant((QVariant *)&local_58);
    QVariant::~QVariant((QVariant *)&local_78);
    value = value + 1;
  }
  QDBusArgument::endArray();
  QDBusArgument::endStructure();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return arg;
  }
  __stack_chk_fail();
}

Assistant:

const QDBusArgument &operator<<(QDBusArgument &arg, const QDBusMenuLayoutItem &item)
{
    arg.beginStructure();
    arg << item.m_id << item.m_properties;
    arg.beginArray(qMetaTypeId<QDBusVariant>());
    for (const QDBusMenuLayoutItem &child : item.m_children)
        arg << QDBusVariant(QVariant::fromValue<QDBusMenuLayoutItem>(child));
    arg.endArray();
    arg.endStructure();
    return arg;
}